

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_zoom(_glist *x,t_floatarg zoom)

{
  t_gobj *x_00;
  int iVar1;
  t_object *x_01;
  t_symbol *s;
  t_gotfn p_Var2;
  t_gobj **pptVar3;
  float fVar4;
  float fVar5;
  
  if ((((float)x->gl_zoom != zoom) || (NAN((float)x->gl_zoom) || NAN(zoom))) &&
     (((zoom == 1.0 && (!NAN(zoom))) || ((zoom == 2.0 && (!NAN(zoom))))))) {
    pptVar3 = &x->gl_list;
    while (x_00 = *pptVar3, x_00 != (t_gobj *)0x0) {
      x_01 = pd_checkobject(&x_00->g_pd);
      if (x_01 != (t_object *)0x0) {
        s = gensym("zoom");
        p_Var2 = zgetfn((t_pd *)x_01,s);
        if ((p_Var2 != (t_gotfn)0x0) &&
           (((x_01->te_g).g_pd != canvas_class || ((x_01[4].te_xpix & 0x100) != 0)))) {
          (*p_Var2)(x_01,zoom);
        }
      }
      pptVar3 = &x_00->g_next;
    }
    x->gl_zoom = (int)zoom;
    if ((x->field_0xe8 & 1) != 0) {
      iVar1 = glist_isgraph(x);
      if (iVar1 == 0) {
        if (x->gl_y2 < x->gl_y1) {
          fVar4 = x->gl_y1 - x->gl_y2;
          fVar5 = ((float)(x->gl_screeny2 - x->gl_screeny1) * fVar4) / (float)x->gl_zoom;
          x->gl_y1 = fVar5;
          x->gl_y2 = fVar5 - fVar4;
        }
      }
      canvas_redraw(x);
      return;
    }
  }
  return;
}

Assistant:

static void canvas_zoom(t_canvas *x, t_floatarg zoom)
{
    if (zoom != x->gl_zoom && (zoom == 1 || zoom == 2))
    {
        t_gobj *g;
        t_object *obj;
        for (g = x->gl_list; g; g = g->g_next)
            if ((obj = pd_checkobject(&g->g_pd)))
        {
                /* pass zoom message on to all objects, except canvases
                   that aren't GOP */
            t_gotfn zoommethod;
            if ((zoommethod = zgetfn(&obj->te_pd, gensym("zoom"))) &&
                (!(pd_class(&obj->te_pd) == canvas_class) ||
                 (((t_glist *)obj)->gl_isgraph)))
                    (*(t_zoomfn)zoommethod)(&obj->te_pd, zoom);
        }
        x->gl_zoom = zoom;
        if (x->gl_havewindow)
        {
            if (!glist_isgraph(x) && (x->gl_y2 < x->gl_y1))
            {
                /* if it's flipped so that y grows upward,
                fix so that zero is bottom edge as in canvas_dosetbounds() */
                t_float diff = x->gl_y1 - x->gl_y2;
                x->gl_y1 = (x->gl_screeny2 - x->gl_screeny1) * diff/x->gl_zoom;
                x->gl_y2 = x->gl_y1 - diff;
            }
            canvas_redraw(x);
        }
    }
}